

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# te.hpp
# Opt level: O1

void __thiscall
te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Circle,0ul>
          (poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  pointer *__ptr;
  
  puVar1 = (undefined8 *)operator_new__(8);
  *puVar1 = 0;
  *(undefined8 **)this = puVar1;
  pvVar2 = operator_new(1);
  *(code **)(this + 8) = dynamic_storage::dynamic_storage<Circle>::anon_class_1_0_00000001::__invoke
  ;
  *(void **)(this + 0x10) = pvVar2;
  *puVar1 = init<1ul,Circle,Drawable::draw(std::ostream&)const::{lambda(void*,std::ostream&)#1}(auto:1_const&,auto:2&)#1},std::ostream&>(te::v1::detail::type_list<Drawable::draw(std::ostream&)const::{lambda(void*,std::ostream&)#1}(auto:1_const&,auto:2&)#1},std::ostream&>)
            ::{lambda(void*,std::ostream&)#1}::ostream__;
  return;
}

Assistant:

constexpr poly(T &&t, std::index_sequence<Ns...>)
      : vtable{sizeof...(Ns)}, storage{std::forward<T>(t)} {
    static_assert(sizeof...(Ns) > 0);
    (init<Ns + 1, T>(decltype(get(detail::mappings<I, Ns + 1>{})){}), ...);
  }